

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
::emplace_value<std::piecewise_construct_t_const&,std::tuple<Vector3<double>const&>,std::tuple<>>
          (btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
           *this,size_type i,allocator_type *alloc,piecewise_construct_t *args,
          tuple<const_Vector3<double>_&> *args_1,tuple<> *args_2)

{
  btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
  bVar1;
  Vector3<double> *pVVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  VType VVar6;
  ulong uVar7;
  long lVar8;
  btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
  *c;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                  ,0x1e1,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<Vector3<double>, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<Vector3<double>, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  uVar7 = (ulong)(byte)this[10];
  if (i <= (long)uVar7) {
    if (i < (long)uVar7) {
      lVar9 = (ulong)(byte)this[10] * 0x20;
      uVar3 = *(undefined8 *)(this + lVar9 + -0x10);
      uVar4 = *(undefined8 *)(this + lVar9 + -0x10 + 8);
      uVar5 = *(undefined8 *)(this + lVar9 + 8);
      *(undefined8 *)(this + lVar9 + 0x20) = *(undefined8 *)(this + lVar9);
      *(undefined8 *)(this + lVar9 + 0x20 + 8) = uVar5;
      *(undefined8 *)(this + lVar9 + 0x10) = uVar3;
      *(undefined8 *)(this + lVar9 + 0x10 + 8) = uVar4;
      lVar9 = uVar7 - 1;
      if (i < lVar9) {
        lVar8 = uVar7 << 0x20;
        lVar10 = lVar8 + -0x200000000;
        do {
          lVar8 = lVar8 + -0x100000000;
          lVar11 = lVar10 >> 0x1b;
          lVar12 = lVar8 >> 0x1b;
          *(undefined8 *)(this + lVar12 + 0x20) = *(undefined8 *)(this + lVar11 + 0x20);
          uVar3 = *(undefined8 *)(this + lVar11 + 0x10 + 8);
          *(undefined8 *)(this + lVar12 + 0x10) = *(undefined8 *)(this + lVar11 + 0x10);
          *(undefined8 *)(this + lVar12 + 0x10 + 8) = uVar3;
          *(undefined4 *)(this + lVar12 + 0x28) = *(undefined4 *)(this + lVar11 + 0x28);
          lVar9 = lVar9 + -1;
          lVar10 = lVar10 + -0x100000000;
        } while (i < lVar9);
      }
    }
    lVar9 = (long)(int)i * 0x20;
    pVVar2 = (args_1->super__Tuple_impl<0UL,_const_Vector3<double>_&>).
             super__Head_base<0UL,_const_Vector3<double>_&,_false>._M_head_impl;
    *(VType *)(this + lVar9 + 0x20) = pVVar2->c_[2];
    VVar6 = pVVar2->c_[1];
    *(VType *)(this + lVar9 + 0x10) = pVVar2->c_[0];
    *(VType *)(this + lVar9 + 0x10 + 8) = VVar6;
    *(undefined4 *)(this + lVar9 + 0x28) = 0;
    bVar1 = this[10];
    this[10] = (btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
                )((char)bVar1 + 1U);
    if (this[0xb] ==
        (btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
         )0x0) {
      uVar7 = (ulong)(byte)((char)bVar1 + 1U);
      lVar9 = i + 1;
      if (lVar9 < (long)uVar7) {
        while (lVar9 < (long)uVar7) {
          c = btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
              ::child((btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                       *)this,(int)(uVar7 - 1));
          btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
          ::set_child((btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                       *)this,(int)uVar7,c);
          uVar7 = uVar7 - 1;
        }
        btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
        ::mutable_child((btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                         *)this,(int)lVar9);
        return;
      }
    }
    return;
  }
  __assert_fail("i <= count()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                ,0x5d5,
                "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>, Args = <const std::piecewise_construct_t &, std::tuple<const Vector3<double> &>, std::tuple<>>]"
               );
}

Assistant:

inline void btree_node<P>::emplace_value(const size_type i,
                                         allocator_type *alloc,
                                         Args &&... args) {
  assert(i <= count());
  // Shift old values to create space for new value and then construct it in
  // place.
  if (i < count()) {
    value_init(count(), alloc, slot(count() - 1));
    for (size_type j = count() - 1; j > i; --j)
      slot_type::move(alloc, slot(j - 1), slot(j));
    value_destroy(i, alloc);
  }
  value_init(i, alloc, std::forward<Args>(args)...);
  set_count(count() + 1);

  if (!leaf() && count() > i + 1) {
    for (int j = count(); j > i + 1; --j) {
      set_child(j, child(j - 1));
    }
    clear_child(i + 1);
  }
}